

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

int __thiscall RenX::Server::sendAdminMessage(Server *this,string_view message)

{
  int iVar1;
  char *in_RCX;
  string_view text;
  string_view str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  str._M_len = message._M_str;
  s_abi_cxx11_(&local_58,"camsg ",6);
  str._M_str = in_RCX;
  escapifyRCON_abi_cxx11_(&local_78,(RenX *)message._M_len,str);
  std::operator+(&local_38,&local_58,&local_78);
  std::operator+(&local_98,&local_38,'\n');
  text._M_str = local_98._M_dataplus._M_p;
  text._M_len = local_98._M_string_length;
  iVar1 = sendSocket(this,text);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return iVar1;
}

Assistant:

int RenX::Server::sendAdminMessage(std::string_view message) {
	return sendSocket("camsg "s + RenX::escapifyRCON(message) + '\n');
}